

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  IMAP *pIVar2;
  connectdata *conn;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  bool bVar5;
  _Bool *p_Var6;
  _Bool _Var7;
  char cVar8;
  CURLcode CVar9;
  int iVar10;
  CURLcode CVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  char *value;
  size_t local_68;
  char *name;
  _Bool *local_40;
  Curl_easy *local_38;
  
  *done = false;
  pIVar2 = (data->req).p.imap;
  pcVar14 = (data->state).up.path;
  lVar15 = 1;
  pcVar12 = pcVar14;
  local_40 = done;
  do {
    pcVar16 = pcVar12;
    pcVar12 = pcVar16 + 1;
    _Var7 = imap_is_bchar(pcVar16[1]);
    lVar15 = lVar15 + -1;
  } while (_Var7);
  if (lVar15 == 0) {
    pIVar2->mailbox = (char *)0x0;
  }
  else {
    pcVar14 = pcVar14 + 1;
    if (*pcVar16 != '/') {
      pcVar16 = pcVar12;
    }
    CVar9 = Curl_urldecode(pcVar14,(long)pcVar16 - (long)pcVar14,&pIVar2->mailbox,(size_t *)0x0,
                           REJECT_CTRL);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
  }
  while (cVar8 = *pcVar12, cVar8 == ';') {
    pcVar14 = pcVar12 + 1;
    pcVar16 = pcVar12 + 2;
    sVar13 = 0;
    pcVar12 = pcVar14;
    while( true ) {
      if (pcVar16[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar16[-1] == '=') break;
      pcVar16 = pcVar16 + 1;
      sVar13 = sVar13 + 1;
      pcVar12 = pcVar12 + 1;
    }
    local_38 = data;
    CVar9 = Curl_urldecode(pcVar14,sVar13,&name,(size_t *)0x0,REJECT_CTRL);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    sVar13 = 0xffffffffffffffff;
    do {
      pcVar14 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
      _Var7 = imap_is_bchar(*pcVar14);
      sVar13 = sVar13 + 1;
    } while (_Var7);
    CVar9 = Curl_urldecode(pcVar16,sVar13,&value,&local_68,REJECT_CTRL);
    if (CVar9 != CURLE_OK) {
      (*Curl_cfree)(name);
      return CVar9;
    }
    iVar10 = curl_strequal(name,"UIDVALIDITY");
    if ((iVar10 == 0) || (pIVar2->uidvalidity != (char *)0x0)) {
      iVar10 = curl_strequal(name,"UID");
      if ((iVar10 == 0) || (pIVar2->uid != (char *)0x0)) {
        iVar10 = curl_strequal(name,"MAILINDEX");
        if ((iVar10 == 0) || (pIVar2->mindex != (char *)0x0)) {
          iVar10 = curl_strequal(name,"SECTION");
          if ((iVar10 == 0) || (pIVar2->section != (char *)0x0)) {
            iVar10 = curl_strequal(name,"PARTIAL");
            if ((iVar10 == 0) || (pIVar2->partial != (char *)0x0)) {
              (*Curl_cfree)(name);
              (*Curl_cfree)(value);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_68 != 0) && (value[local_68 - 1] == '/')) {
              value[local_68 - 1] = '\0';
            }
            pIVar2->partial = value;
          }
          else {
            if ((local_68 != 0) && (value[local_68 - 1] == '/')) {
              value[local_68 - 1] = '\0';
            }
            pIVar2->section = value;
          }
        }
        else {
          if ((local_68 != 0) && (value[local_68 - 1] == '/')) {
            value[local_68 - 1] = '\0';
          }
          pIVar2->mindex = value;
        }
      }
      else {
        if ((local_68 != 0) && (value[local_68 - 1] == '/')) {
          value[local_68 - 1] = '\0';
        }
        pIVar2->uid = value;
      }
    }
    else {
      if ((local_68 != 0) && (value[local_68 - 1] == '/')) {
        value[local_68 - 1] = '\0';
      }
      pIVar2->uidvalidity = value;
    }
    value = (char *)0x0;
    (*Curl_cfree)(name);
    (*Curl_cfree)(value);
    data = local_38;
  }
  if (((pIVar2->mailbox != (char *)0x0) && (pIVar2->uid == (char *)0x0)) &&
     (pIVar2->mindex == (char *)0x0)) {
    curl_url_get((data->state).uh,CURLUPART_QUERY,&pIVar2->query,0x40);
    cVar8 = *pcVar12;
  }
  if (cVar8 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pcVar14 = (data->set).str[0x1c];
  if (pcVar14 != (char *)0x0) {
    pIVar2 = (data->req).p.imap;
    CVar9 = Curl_urldecode(pcVar14,0,&pIVar2->custom,(size_t *)0x0,REJECT_CTRL);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    pcVar14 = pIVar2->custom;
    pcVar12 = pcVar14;
    for (; *pcVar14 != '\0'; pcVar14 = pcVar14 + 1) {
      if (*pcVar14 == ' ') {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        pIVar2->custom_params = pcVar14;
        *pcVar12 = '\0';
        if (pIVar2->custom_params == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar12 = pcVar12 + 1;
    }
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  conn = data->conn;
  pIVar2 = (data->req).p.imap;
  if (((data->req).field_0xd3 & 2) != 0) {
    pIVar2->transfer = PPTRANSFER_INFO;
  }
  *local_40 = false;
  if ((((pIVar2->mailbox == (char *)0x0) ||
       (pcVar14 = (conn->proto).imapc.mailbox, pcVar14 == (char *)0x0)) ||
      (iVar10 = curl_strequal(pIVar2->mailbox,pcVar14), iVar10 == 0)) ||
     (((pIVar2->uidvalidity != (char *)0x0 &&
       (pcVar14 = (conn->proto).ftpc.server_os, pcVar14 != (char *)0x0)) &&
      (iVar10 = curl_strequal(pIVar2->uidvalidity,pcVar14), iVar10 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  if ((((data->state).field_0x7c0 & 8) == 0) && ((data->set).mimepost.kind == MIMEKIND_NONE)) {
    if (pIVar2->custom == (char *)0x0) {
      if (bVar5) {
        if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
          if (pIVar2->query == (char *)0x0) goto LAB_0013ba88;
          CVar9 = imap_perform_search(data);
        }
        else {
          CVar9 = imap_perform_fetch(data);
        }
        goto LAB_0013ba93;
      }
      if (pIVar2->mailbox != (char *)0x0) {
        if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
          pcVar14 = pIVar2->query;
          goto joined_r0x0013b9b0;
        }
        goto LAB_0013b9b6;
      }
    }
    else if (!bVar5) {
      pcVar14 = pIVar2->mailbox;
joined_r0x0013b9b0:
      if (pcVar14 != (char *)0x0) {
LAB_0013b9b6:
        pcVar4 = data->conn;
        pFVar3 = (data->req).p.file;
        (*Curl_cfree)((pcVar4->proto).imapc.mailbox);
        (pcVar4->proto).ftpc.retr_size_saved = 0;
        (*Curl_cfree)((pcVar4->proto).ftpc.server_os);
        (pcVar4->proto).ftpc.server_os = (char *)0x0;
        pcVar14 = pFVar3->freepath;
        if (pcVar14 == (char *)0x0) {
          Curl_failf(data,"Cannot SELECT without a mailbox.");
          return CURLE_URL_MALFORMAT;
        }
        pcVar14 = imap_atom(pcVar14,false);
        if (pcVar14 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar9 = imap_sendf(data,"SELECT %s",pcVar14);
        (*Curl_cfree)(pcVar14);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        (data->conn->proto).imapc.state = IMAP_SELECT;
        goto LAB_0013ba9c;
      }
    }
LAB_0013ba88:
    CVar9 = imap_perform_list(data);
  }
  else {
    pFVar3 = (data->req).p.file;
    if (pFVar3->freepath == (char *)0x0) {
      Curl_failf(data,"Cannot APPEND without a mailbox.");
      CVar9 = CURLE_URL_MALFORMAT;
    }
    else if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      CVar9 = Curl_creader_set_fread(data,(data->state).infilesize);
      if (CVar9 == CURLE_OK) {
        lVar15 = (data->state).infilesize;
LAB_0013b839:
        if (lVar15 < 0) {
          Curl_failf(data,"Cannot APPEND with unknown input file size");
          CVar9 = CURLE_UPLOAD_FAILED;
        }
        else {
          pcVar14 = imap_atom(pFVar3->freepath,false);
          if (pcVar14 == (char *)0x0) {
            CVar9 = CURLE_OUT_OF_MEMORY;
          }
          else {
            Curl_dyn_init((dynbuf *)&name,100);
            if ((data->set).upload_flags == '\0') {
              CVar11 = Curl_dyn_add((dynbuf *)&name,"");
              CVar9 = CURLE_OK;
LAB_0013baef:
              if (CVar11 == CURLE_OK) {
                pcVar12 = Curl_dyn_ptr((dynbuf *)&name);
                CVar9 = imap_sendf(data,"APPEND %s%s {%ld}",pcVar14,pcVar12,(data->state).infilesize
                                  );
              }
            }
            else {
              CVar11 = Curl_dyn_add((dynbuf *)&name," (");
              CVar9 = CURLE_OUT_OF_MEMORY;
              if (CVar11 == CURLE_OK) {
                for (lVar15 = 8; lVar15 != 0x58; lVar15 = lVar15 + 0x10) {
                  if (((*(uint *)((long)&saslimap.defmechs + lVar15) &
                       (uint)(data->set).upload_flags) != 0) &&
                     (((sVar13 = Curl_dyn_len((dynbuf *)&name), 2 < sVar13 &&
                       (CVar11 = Curl_dyn_add((dynbuf *)&name," "), CVar11 != CURLE_OK)) ||
                      ((CVar11 = Curl_dyn_add((dynbuf *)&name,"\\"), CVar11 != CURLE_OK ||
                       (CVar11 = Curl_dyn_add((dynbuf *)&name,
                                              *(char **)((long)&DAT_0019f510 + lVar15)),
                       CVar11 != CURLE_OK)))))) goto LAB_0013bb1e;
                }
                CVar11 = Curl_dyn_add((dynbuf *)&name,")");
                goto LAB_0013baef;
              }
            }
LAB_0013bb1e:
            Curl_dyn_free((dynbuf *)&name);
            (*Curl_cfree)(pcVar14);
            if (CVar9 == CURLE_OK) {
              (data->conn->proto).imapc.state = IMAP_APPEND;
              CVar9 = CURLE_OK;
            }
          }
        }
      }
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar9 = Curl_mime_prepare_headers(data,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if ((CVar9 == CURLE_OK) &&
         (((pcVar14 = Curl_checkheaders(data,"Mime-Version",0xc), pcVar14 != (char *)0x0 ||
           (CVar9 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
           CVar9 == CURLE_OK)) && (CVar9 = Curl_creader_set_mime(data,part), CVar9 == CURLE_OK)))) {
        lVar15 = Curl_creader_client_length(data);
        (data->state).infilesize = lVar15;
        goto LAB_0013b839;
      }
    }
  }
LAB_0013ba93:
  if (CVar9 != CURLE_OK) {
    return CVar9;
  }
LAB_0013ba9c:
  p_Var6 = local_40;
  CVar9 = imap_multi_statemach(data,local_40);
  _Var7 = false;
  Curl_conn_is_connected(conn,0);
  if ((CVar9 == CURLE_OK) && (CVar9 = CURLE_OK, *p_Var6 == true)) {
    imap_dophase_done(data,_Var7);
  }
  return CVar9;
}

Assistant:

static CURLcode imap_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(data);
  if(result)
    return result;

  result = imap_regular_transfer(data, done);

  return result;
}